

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_avx512::forward
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  uint uVar5;
  size_t sVar6;
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  __m512 v_03;
  __m512 v_04;
  __m512 v_05;
  __m512 v_06;
  int iVar7;
  int iVar8;
  sbyte sVar9;
  uint uVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  undefined1 (*pauVar15) [32];
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [64];
  ulong uVar18;
  _func_int *p_Var19;
  Mat *pMVar20;
  uint uVar21;
  Mat *pMVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [16];
  undefined1 (*pauVar30) [64];
  int iVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined8 in_XMM1_Qa;
  __m128 v_07;
  __m128 v_08;
  __m128 v_09;
  __m128 v_10;
  Mat m;
  Option opt_pack1;
  undefined8 in_stack_fffffffffffffec0;
  Allocator *pAVar40;
  Padding_x86_avx512 *pPVar41;
  Padding_x86_avx512 *pPVar42;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  void *in_stack_fffffffffffffed8;
  void *__ptr;
  undefined1 (*__ptr_00) [32];
  undefined1 (*__ptr_01) [16];
  undefined1 (*__ptr_02) [64];
  int *in_stack_fffffffffffffee0;
  int *piVar43;
  int *piVar44;
  size_t in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Allocator *in_stack_fffffffffffffef8;
  undefined8 local_b8;
  undefined1 local_78 [72];
  
  p_Var19 = this->_vptr_Padding_x86_avx512[-3];
  uVar21 = *(uint *)(&this->field_0xd0 + (long)p_Var19);
  if ((((uVar21 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var19) == 0)) &&
      (*(int *)(&this->field_0xd8 + (long)p_Var19) == 0)) &&
     (((*(int *)(&this->field_0xdc + (long)p_Var19) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var19) == 0)) &&
      (*(int *)(&this->field_0xec + (long)p_Var19) == 0)))) {
    if (top_blob != bottom_blob) {
      piVar44 = bottom_blob->refcount;
      if (piVar44 != (int *)0x0) {
        LOCK();
        *piVar44 = *piVar44 + 1;
        UNLOCK();
      }
      piVar44 = top_blob->refcount;
      if (piVar44 != (int *)0x0) {
        LOCK();
        *piVar44 = *piVar44 + -1;
        UNLOCK();
        if (*piVar44 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar44 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar44;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar7 = bottom_blob->w;
      iVar31 = bottom_blob->h;
      iVar23 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar7;
      top_blob->h = iVar31;
      top_blob->d = iVar23;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  iVar7 = bottom_blob->elempack;
  uVar25 = bottom_blob->elemsize;
  if (iVar7 != 0) {
    if (((int)uVar25 * 8) / iVar7 == 8) {
      iVar7 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar7;
    }
    iVar23 = bottom_blob->w;
    iVar8 = bottom_blob->h;
    iVar27 = bottom_blob->d;
    uVar13 = bottom_blob->c;
    iVar31 = bottom_blob->dims;
    if (iVar7 == 4) {
      switch(iVar31) {
      case 1:
        uVar21 = *(uint *)(&this->field_0xd8 + (long)p_Var19) + iVar23 * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var19);
        sVar9 = 3;
        if ((uVar21 & 7) != 0) {
          sVar9 = ((uVar21 & 3) == 0) * '\x02';
        }
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var19) & 3) == 0) && ((uVar21 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          Mat::create(top_blob,(int)uVar21 >> 2,(uVar25 >> 2) << sVar9,4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var19 = this->_vptr_Padding_x86_avx512[-3];
            iVar7 = *(int *)(&this->field_0xd8 + (long)p_Var19);
            iVar31 = iVar7 + 3;
            if (-1 < iVar7) {
              iVar31 = iVar7;
            }
            v_07[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
            v_07[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
            iVar7 = *(int *)(&this->field_0xdc + (long)p_Var19);
            iVar23 = iVar7 + 3;
            if (-1 < iVar7) {
              iVar23 = iVar7;
            }
            v_07[2] = (float)(int)in_XMM1_Qa;
            v_07[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0
                       ,iVar31 >> 2,iVar23 >> 2,v_07);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar13 = uVar21 + iVar8 * 4 + *(int *)(&this->field_0xd4 + (long)p_Var19);
        sVar9 = 3;
        if ((uVar13 & 7) != 0) {
          sVar9 = ((uVar13 & 3) == 0) * '\x02';
        }
        if ((((uVar21 & 3) == 0) && ((uVar13 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),(int)uVar13 >> 2,
                      (uVar25 >> 2) << sVar9,4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var19 = this->_vptr_Padding_x86_avx512[-3];
            v_10[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
            v_10[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
            iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var19);
            iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var19);
            iVar23 = iVar7 + 3;
            if (-1 < iVar7) {
              iVar23 = iVar7;
            }
            iVar7 = iVar31 + 3;
            if (-1 < iVar31) {
              iVar7 = iVar31;
            }
            v_10[2] = (float)(int)in_XMM1_Qa;
            v_10[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                       iVar23 >> 2,iVar7 >> 2,*(int *)(&this->field_0xd8 + (long)p_Var19),
                       *(int *)(&this->field_0xdc + (long)p_Var19),v_10);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar10 = *(uint *)(&this->field_0xe8 + (long)p_Var19) + uVar13 * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var19);
        sVar9 = ((uVar10 & 3) == 0) * '\x02';
        if ((uVar10 & 7) == 0) {
          sVar9 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var19) & 3) == 0) && ((uVar10 & 7) == 4)) {
          if ((uVar10 == uVar13 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
            uVar10 = (int)uVar10 >> 2;
            Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                                 *(int *)(&this->field_0xdc + (long)p_Var19),
                        uVar21 + iVar8 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar10,
                        (uVar25 >> 2) << sVar9,4,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar7 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
              iVar31 = iVar7 + 3;
              if (-1 < iVar7) {
                iVar31 = iVar7;
              }
              if ((int)uVar10 < 1) {
                return 0;
              }
              iVar31 = -(iVar31 >> 2);
              uVar25 = 0;
              iVar7 = iVar31;
              do {
                uVar34 = top_blob->elemsize;
                uVar12 = (long)top_blob->h * (long)top_blob->w;
                uVar18 = (uVar34 * uVar12 + 0xf & 0xfffffffffffffff0) / uVar34;
                if (top_blob->dims == 4) {
                  uVar18 = uVar12;
                }
                pp_Var11 = this->_vptr_Padding_x86_avx512;
                p_Var19 = pp_Var11[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                  uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
                  auVar36._4_4_ = uVar2;
                  auVar36._0_4_ = uVar2;
                  auVar36._8_4_ = uVar2;
                  auVar36._12_4_ = uVar2;
                }
                else {
                  auVar36 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar25 * 0x10);
                }
                pMVar20 = (Mat *)(top_blob->cstep * uVar25 * uVar34 + (long)top_blob->data);
                uVar21 = iVar31 + (int)uVar25;
                if ((int)uVar21 < 0 || (int)uVar13 <= (int)uVar21) {
                  iVar23 = (int)uVar18 * top_blob->d;
                  if (0 < iVar23) {
                    do {
                      pMVar20->data = (void *)auVar36._0_8_;
                      pMVar20->refcount = (int *)auVar36._8_8_;
                      pMVar20 = (Mat *)&pMVar20->elemsize;
                      iVar23 = iVar23 + -1;
                    } while (iVar23 != 0);
                  }
                }
                else {
                  uVar32 = bottom_blob->w;
                  iVar23 = bottom_blob->h;
                  pauVar16 = (undefined1 (*) [16])
                             ((ulong)uVar21 * bottom_blob->cstep * bottom_blob->elemsize +
                             (long)bottom_blob->data);
                  pAVar40 = bottom_blob->allocator;
                  piVar44 = (int *)0x0;
                  iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                  iVar31 = iVar7;
                  __ptr_01 = pauVar16;
                  if (iVar8 == 0) {
                    v_08._0_8_ = auVar36._0_8_;
                    v_08[2] = (float)(int)in_XMM1_Qa;
                    v_08[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    pPVar41 = this;
                    padding_constant_pack4_sse
                              ((ncnn *)&stack0xfffffffffffffed8,pMVar20,
                               (Mat *)(ulong)(uint)top_blob->w,
                               *(int *)(&this->field_0xd0 + (long)p_Var19),
                               *(int *)(&this->field_0xd4 + (long)p_Var19),
                               *(int *)(&this->field_0xd8 + (long)p_Var19),
                               *(int *)(&this->field_0xdc + (long)p_Var19),v_08);
                    pp_Var11 = this->_vptr_Padding_x86_avx512;
                    p_Var19 = pp_Var11[-3];
                    iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                    this = pPVar41;
                    iVar31 = iVar7;
                  }
                  if (iVar8 == 1) {
                    iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                    iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                    iVar27 = *(int *)(&this->field_0xd8 + (long)p_Var19);
                    iVar14 = *(int *)(&this->field_0xdc + (long)p_Var19);
                    pMVar22 = pMVar20;
                    if (0 < iVar7) {
                      iVar24 = 0;
                      do {
                        auVar37 = *pauVar16;
                        iVar26 = iVar27;
                        if (0 < iVar27) {
                          do {
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                        }
                        if (0 < (int)uVar32) {
                          iVar26 = 0;
                          pauVar29 = pauVar16;
                          do {
                            auVar37 = *pauVar29;
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pauVar29 = pauVar29 + 1;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar26 = iVar26 + 1;
                          } while (iVar26 < (int)uVar32);
                        }
                        iVar26 = iVar14;
                        if (0 < iVar14) {
                          do {
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                        }
                        iVar24 = iVar24 + 1;
                      } while (iVar24 != iVar7);
                    }
                    if (0 < iVar23) {
                      iVar7 = 0;
                      do {
                        auVar37 = *pauVar16;
                        iVar24 = iVar27;
                        if (0 < iVar27) {
                          do {
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar24 = iVar24 + -1;
                          } while (iVar24 != 0);
                        }
                        if (0 < (int)uVar32) {
                          iVar24 = 0;
                          do {
                            auVar37 = *pauVar16;
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pauVar16 = pauVar16 + 1;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar24 = iVar24 + 1;
                          } while (iVar24 < (int)uVar32);
                        }
                        iVar24 = iVar14;
                        if (0 < iVar14) {
                          do {
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar24 = iVar24 + -1;
                          } while (iVar24 != 0);
                        }
                        iVar7 = iVar7 + 1;
                      } while (iVar7 < iVar23);
                    }
                    if (0 < iVar8) {
                      iVar7 = 0;
                      do {
                        auVar37 = pauVar16[-(long)(int)uVar32];
                        iVar24 = iVar27;
                        if (0 < iVar27) {
                          do {
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar24 = iVar24 + -1;
                          } while (iVar24 != 0);
                        }
                        if (0 < (int)uVar32) {
                          iVar24 = 0;
                          pauVar29 = pauVar16 + -(long)(int)uVar32;
                          do {
                            auVar37 = *pauVar29;
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pauVar29 = pauVar29 + 1;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar24 = iVar24 + 1;
                          } while (iVar24 < (int)uVar32);
                        }
                        iVar24 = iVar14;
                        if (0 < iVar14) {
                          do {
                            pMVar22->data = (void *)auVar37._0_8_;
                            pMVar22->refcount = (int *)auVar37._8_8_;
                            pMVar22 = (Mat *)&pMVar22->elemsize;
                            iVar24 = iVar24 + -1;
                          } while (iVar24 != 0);
                        }
                        iVar7 = iVar7 + 1;
                      } while (iVar7 != iVar8);
                    }
                  }
                  p_Var19 = pp_Var11[-3];
                  if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 2) {
                    iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                    iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                    uVar21 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
                    uVar34 = (ulong)uVar21;
                    uVar5 = *(uint *)(&this->field_0xdc + (long)p_Var19);
                    uVar18 = (ulong)uVar5;
                    pauVar16 = (undefined1 (*) [16])
                               (*__ptr_01 + (long)(int)(iVar7 * uVar32 * 4) * 4);
                    if (0 < iVar7) {
                      iVar27 = 0;
                      do {
                        lVar33 = uVar34 << 4;
                        if (0 < (int)uVar21) {
                          do {
                            *(undefined1 (*) [16])pMVar20 =
                                 *(undefined1 (*) [16])(*pauVar16 + lVar33);
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            lVar33 = lVar33 + -0x10;
                          } while (lVar33 != 0);
                        }
                        pauVar29 = pauVar16;
                        if (0 < (int)uVar32) {
                          iVar14 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar20 = *pauVar29;
                            pauVar29 = pauVar29 + 1;
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            iVar14 = iVar14 + 1;
                          } while (iVar14 < (int)uVar32);
                        }
                        if (0 < (int)uVar5) {
                          lVar33 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar20 =
                                 *(undefined1 (*) [16])(*pauVar29 + lVar33);
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            lVar1 = uVar18 * 0x10 + lVar33;
                            lVar33 = lVar33 + -0x10;
                          } while (lVar1 != -0x10);
                        }
                        pauVar16 = (undefined1 (*) [16])
                                   ((long)pauVar16 + (long)(int)(uVar32 * 4) * -4);
                        iVar27 = iVar27 + 1;
                      } while (iVar27 != iVar7);
                    }
                    if (0 < iVar23) {
                      iVar7 = 0;
                      do {
                        lVar33 = uVar34 << 4;
                        if (0 < (int)uVar21) {
                          do {
                            *(undefined1 (*) [16])pMVar20 =
                                 *(undefined1 (*) [16])(*pauVar16 + lVar33);
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            lVar33 = lVar33 + -0x10;
                          } while (lVar33 != 0);
                        }
                        if (0 < (int)uVar32) {
                          iVar27 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar20 = *pauVar16;
                            pauVar16 = pauVar16 + 1;
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            iVar27 = iVar27 + 1;
                          } while (iVar27 < (int)uVar32);
                        }
                        if (0 < (int)uVar5) {
                          lVar33 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar20 =
                                 *(undefined1 (*) [16])(*pauVar16 + lVar33);
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            lVar1 = uVar18 * 0x10 + lVar33;
                            lVar33 = lVar33 + -0x10;
                          } while (lVar1 != -0x10);
                        }
                        iVar7 = iVar7 + 1;
                      } while (iVar7 < iVar23);
                    }
                    if (0 < iVar8) {
                      uVar12 = (ulong)(int)uVar32;
                      pauVar16 = pauVar16 + uVar12 * -2;
                      iVar7 = 0;
                      do {
                        lVar33 = uVar34 << 4;
                        if (0 < (int)uVar21) {
                          do {
                            *(undefined1 (*) [16])pMVar20 =
                                 *(undefined1 (*) [16])(*pauVar16 + lVar33);
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            lVar33 = lVar33 + -0x10;
                          } while (lVar33 != 0);
                          uVar12 = (ulong)uVar32;
                        }
                        pauVar29 = pauVar16;
                        if (0 < (int)uVar12) {
                          iVar23 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar20 = *pauVar29;
                            pauVar29 = pauVar29 + 1;
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            iVar23 = iVar23 + 1;
                            uVar12 = (ulong)uVar32;
                          } while (iVar23 < (int)uVar32);
                        }
                        if (0 < (int)uVar5) {
                          lVar33 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar20 =
                                 *(undefined1 (*) [16])(*pauVar29 + lVar33);
                            pMVar20 = (Mat *)&pMVar20->elemsize;
                            lVar1 = uVar18 * 0x10 + lVar33;
                            lVar33 = lVar33 + -0x10;
                          } while (lVar1 != -0x10);
                          uVar12 = (ulong)uVar32;
                        }
                        pauVar16 = (undefined1 (*) [16])
                                   ((long)pauVar16 + (long)((int)uVar12 * 4) * -4);
                        iVar7 = iVar7 + 1;
                      } while (iVar7 != iVar8);
                    }
                  }
                  iVar7 = iVar31;
                  if (piVar44 != (int *)0x0) {
                    LOCK();
                    *piVar44 = *piVar44 + -1;
                    UNLOCK();
                    if (*piVar44 == 0) {
                      if (pAVar40 == (Allocator *)0x0) {
                        if (__ptr_01 != (undefined1 (*) [16])0x0) {
                          free(__ptr_01);
                        }
                      }
                      else {
                        (*pAVar40->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar10);
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0) {
          uVar10 = *(int *)(&this->field_0xe8 + (long)p_Var19) + iVar27 +
                   *(int *)(&this->field_0xec + (long)p_Var19);
          Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),
                      uVar21 + iVar8 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar10,uVar13,
                      uVar25,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar13 < 1) {
              return 0;
            }
            uVar25 = (ulong)uVar10;
            uVar34 = 0;
            do {
              p_Var19 = this->_vptr_Padding_x86_avx512[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
                auVar37._4_4_ = uVar2;
                auVar37._0_4_ = uVar2;
                auVar37._8_4_ = uVar2;
                auVar37._12_4_ = uVar2;
              }
              else {
                auVar37 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar34 * 0x10);
              }
              pPVar41 = this;
              if (0 < (int)uVar10) {
                uVar18 = 0;
                do {
                  uVar12 = (long)top_blob->h * (long)top_blob->w;
                  pMVar20 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar18 * uVar12 +
                                   top_blob->cstep * uVar34 * top_blob->elemsize);
                  p_Var19 = this->_vptr_Padding_x86_avx512[-3];
                  iVar7 = (int)uVar18 - *(int *)(&this->field_0xe8 + (long)p_Var19);
                  if (iVar7 < 0 || iVar27 <= iVar7) {
                    if (0 < (int)uVar12) {
                      do {
                        pMVar20->data = (void *)auVar37._0_8_;
                        pMVar20->refcount = (int *)auVar37._8_8_;
                        pMVar20 = (Mat *)&pMVar20->elemsize;
                        uVar21 = (int)uVar12 - 1;
                        uVar12 = (ulong)uVar21;
                      } while (uVar21 != 0);
                    }
                  }
                  else {
                    local_b8 = auVar37._0_8_;
                    v_09[2] = (float)(int)in_XMM1_Qa;
                    v_09[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    v_09[0] = (float)(undefined4)local_b8;
                    v_09[1] = (float)local_b8._4_4_;
                    pPVar42 = pPVar41;
                    padding_constant_pack4_sse
                              ((ncnn *)&stack0xfffffffffffffed8,pMVar20,(Mat *)(long)top_blob->w,
                               *(int *)(&pPVar41->field_0xd0 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd4 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd8 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xdc + (long)p_Var19),v_09);
                    this = pPVar41;
                    pPVar41 = pPVar42;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar25);
              }
              uVar34 = uVar34 + 1;
              this = pPVar41;
            } while (uVar34 != uVar13);
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar7 == 8) {
      switch(iVar31) {
      case 1:
        uVar21 = *(uint *)(&this->field_0xd8 + (long)p_Var19) + iVar23 * 8 +
                 *(int *)(&this->field_0xdc + (long)p_Var19);
        sVar9 = 3;
        if ((uVar21 & 7) != 0) {
          sVar9 = ((uVar21 & 3) == 0) * '\x02';
        }
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var19) | uVar21) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          uVar13 = uVar21 + 7;
          if (-1 < (int)uVar21) {
            uVar13 = uVar21;
          }
          Mat::create(top_blob,(int)uVar13 >> 3,(uVar25 >> 3) << sVar9,8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar7 = *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_avx512[-3]);
              iVar31 = iVar7 + 7;
              if (-1 < iVar7) {
                iVar31 = iVar7;
              }
              iVar7 = *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_avx512[-3]);
              iVar23 = iVar7 + 7;
              if (-1 < iVar7) {
                iVar23 = iVar7;
              }
              v._8_8_ = this;
              v[0] = (float)(int)in_stack_fffffffffffffec0;
              v[1] = (float)(int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
              v[4] = (float)in_stack_fffffffffffffed0;
              v[5] = (float)in_stack_fffffffffffffed4;
              v._24_8_ = in_stack_fffffffffffffed8;
              padding_constant_pack8_avx
                        ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0
                         ,0,iVar31 >> 3,iVar23 >> 3,v);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 2:
        uVar13 = uVar21 + iVar8 * 8 + *(int *)(&this->field_0xd4 + (long)p_Var19);
        sVar9 = 3;
        if ((uVar13 & 7) != 0) {
          sVar9 = ((uVar13 & 3) == 0) * '\x02';
        }
        if ((((uVar21 | uVar13) & 7) == 0) && (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          uVar21 = uVar13 + 7;
          if (-1 < (int)uVar13) {
            uVar21 = uVar13;
          }
          Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),(int)uVar21 >> 3,
                      (uVar25 >> 3) << sVar9,8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var19 = this->_vptr_Padding_x86_avx512[-3];
              iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var19);
              iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var19);
              iVar23 = iVar7 + 7;
              if (-1 < iVar7) {
                iVar23 = iVar7;
              }
              iVar7 = iVar31 + 7;
              if (-1 < iVar31) {
                iVar7 = iVar31;
              }
              v_02._8_8_ = this;
              v_02[0] = (float)(int)in_stack_fffffffffffffec0;
              v_02[1] = (float)(int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
              v_02[4] = (float)in_stack_fffffffffffffed0;
              v_02[5] = (float)in_stack_fffffffffffffed4;
              v_02._24_8_ = in_stack_fffffffffffffed8;
              padding_constant_pack8_avx
                        ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                         iVar23 >> 3,iVar7 >> 3,*(int *)(&this->field_0xd8 + (long)p_Var19),
                         *(int *)(&this->field_0xdc + (long)p_Var19),v_02);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 3:
        uVar10 = *(uint *)(&this->field_0xe8 + (long)p_Var19) + uVar13 * 8 +
                 *(int *)(&this->field_0xec + (long)p_Var19);
        sVar9 = ((uVar10 & 3) == 0) * '\x02';
        if ((uVar10 & 7) == 0) {
          sVar9 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var19) | uVar10) & 7) == 0) {
          if ((uVar10 == uVar13 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
            uVar32 = uVar10 + 7;
            if (-1 < (int)uVar10) {
              uVar32 = uVar10;
            }
            Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                                 *(int *)(&this->field_0xdc + (long)p_Var19),
                        uVar21 + iVar8 + *(int *)(&this->field_0xd4 + (long)p_Var19),
                        (int)uVar32 >> 3,(uVar25 >> 3) << sVar9,8,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep == 0) {
              return -100;
            }
            iVar7 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
            iVar31 = iVar7 + 7;
            if (-1 < iVar7) {
              iVar31 = iVar7;
            }
            if ((int)uVar10 < 8) {
              return 0;
            }
            iVar31 = -(iVar31 >> 3);
            uVar25 = 0;
            iVar7 = iVar31;
            do {
              uVar34 = top_blob->elemsize;
              uVar12 = (long)top_blob->h * (long)top_blob->w;
              uVar18 = (uVar34 * uVar12 + 0xf & 0xfffffffffffffff0) / uVar34;
              if (top_blob->dims == 4) {
                uVar18 = uVar12;
              }
              pp_Var11 = this->_vptr_Padding_x86_avx512;
              p_Var19 = pp_Var11[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
                auVar38._4_4_ = uVar2;
                auVar38._0_4_ = uVar2;
                auVar38._8_4_ = uVar2;
                auVar38._12_4_ = uVar2;
                auVar38._16_4_ = uVar2;
                auVar38._20_4_ = uVar2;
                auVar38._24_4_ = uVar2;
                auVar38._28_4_ = uVar2;
              }
              else {
                auVar38 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar25 * 0x20);
              }
              pMVar20 = (Mat *)(top_blob->cstep * uVar25 * uVar34 + (long)top_blob->data);
              uVar21 = iVar31 + (int)uVar25;
              if ((int)uVar21 < 0 || (int)uVar13 <= (int)uVar21) {
                iVar23 = (int)uVar18 * top_blob->d;
                if (0 < iVar23) {
                  do {
                    pMVar20->data = (void *)auVar38._0_8_;
                    pMVar20->refcount = (int *)auVar38._8_8_;
                    pMVar20->elemsize = auVar38._16_8_;
                    pMVar20->elempack = auVar38._24_4_;
                    *(int *)&pMVar20->field_0x1c = auVar38._28_4_;
                    pMVar20 = (Mat *)&pMVar20->allocator;
                    iVar23 = iVar23 + -1;
                  } while (iVar23 != 0);
                }
              }
              else {
                uVar10 = bottom_blob->w;
                iVar23 = bottom_blob->h;
                pauVar15 = (undefined1 (*) [32])
                           ((ulong)uVar21 * bottom_blob->cstep * bottom_blob->elemsize +
                           (long)bottom_blob->data);
                pAVar40 = bottom_blob->allocator;
                piVar44 = (int *)0x0;
                iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                iVar31 = iVar7;
                __ptr_00 = pauVar15;
                if (iVar8 == 0) {
                  v_00._8_8_ = this;
                  v_00[0] = (float)(int)in_stack_fffffffffffffec0;
                  v_00[1] = (float)(int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
                  v_00[4] = (float)in_stack_fffffffffffffed0;
                  v_00[5] = (float)iVar7;
                  v_00._24_8_ = pauVar15;
                  pPVar41 = this;
                  padding_constant_pack8_avx
                            ((ncnn *)&stack0xfffffffffffffed8,pMVar20,
                             (Mat *)(ulong)(uint)top_blob->w,
                             *(int *)(&this->field_0xd0 + (long)p_Var19),
                             *(int *)(&this->field_0xd4 + (long)p_Var19),
                             *(int *)(&this->field_0xd8 + (long)p_Var19),
                             *(int *)(&this->field_0xdc + (long)p_Var19),v_00);
                  pp_Var11 = this->_vptr_Padding_x86_avx512;
                  p_Var19 = pp_Var11[-3];
                  iVar8 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                  this = pPVar41;
                  iVar31 = iVar7;
                }
                if (iVar8 == 1) {
                  iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                  iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                  iVar27 = *(int *)(&this->field_0xd8 + (long)p_Var19);
                  iVar14 = *(int *)(&this->field_0xdc + (long)p_Var19);
                  pMVar22 = pMVar20;
                  if (0 < iVar7) {
                    iVar24 = 0;
                    do {
                      auVar39 = *pauVar15;
                      iVar26 = iVar27;
                      if (0 < iVar27) {
                        do {
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      if (0 < (int)uVar10) {
                        iVar26 = 0;
                        pauVar28 = pauVar15;
                        do {
                          auVar39 = *pauVar28;
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pauVar28 = pauVar28 + 1;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar26 = iVar26 + 1;
                        } while (iVar26 < (int)uVar10);
                      }
                      iVar26 = iVar14;
                      if (0 < iVar14) {
                        do {
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 != iVar7);
                  }
                  if (0 < iVar23) {
                    iVar7 = 0;
                    do {
                      auVar39 = *pauVar15;
                      iVar24 = iVar27;
                      if (0 < iVar27) {
                        do {
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      if (0 < (int)uVar10) {
                        iVar24 = 0;
                        do {
                          auVar39 = *pauVar15;
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pauVar15 = pauVar15 + 1;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar24 = iVar24 + 1;
                        } while (iVar24 < (int)uVar10);
                      }
                      iVar24 = iVar14;
                      if (0 < iVar14) {
                        do {
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      iVar7 = iVar7 + 1;
                    } while (iVar7 < iVar23);
                  }
                  if (0 < iVar8) {
                    iVar7 = 0;
                    do {
                      auVar39 = pauVar15[-(long)(int)uVar10];
                      iVar24 = iVar27;
                      if (0 < iVar27) {
                        do {
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      if (0 < (int)uVar10) {
                        iVar24 = 0;
                        pauVar28 = pauVar15 + -(long)(int)uVar10;
                        do {
                          auVar39 = *pauVar28;
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pauVar28 = pauVar28 + 1;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar24 = iVar24 + 1;
                        } while (iVar24 < (int)uVar10);
                      }
                      iVar24 = iVar14;
                      if (0 < iVar14) {
                        do {
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22 = (Mat *)&pMVar22->allocator;
                          iVar24 = iVar24 + -1;
                        } while (iVar24 != 0);
                      }
                      iVar7 = iVar7 + 1;
                    } while (iVar7 != iVar8);
                  }
                }
                p_Var19 = pp_Var11[-3];
                if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 2) {
                  iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                  iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                  uVar21 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
                  uVar34 = (ulong)uVar21;
                  uVar5 = *(uint *)(&this->field_0xdc + (long)p_Var19);
                  uVar18 = (ulong)uVar5;
                  pauVar15 = (undefined1 (*) [32])(*__ptr_00 + (long)(int)(iVar7 * uVar10 * 8) * 4);
                  if (0 < iVar7) {
                    iVar27 = 0;
                    do {
                      lVar33 = uVar34 << 5;
                      if (0 < (int)uVar21) {
                        do {
                          *(undefined1 (*) [32])pMVar20 = *(undefined1 (*) [32])(*pauVar15 + lVar33)
                          ;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          lVar33 = lVar33 + -0x20;
                        } while (lVar33 != 0);
                      }
                      pauVar28 = pauVar15;
                      if (0 < (int)uVar10) {
                        iVar14 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar20 = *pauVar28;
                          pauVar28 = pauVar28 + 1;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          iVar14 = iVar14 + 1;
                        } while (iVar14 < (int)uVar10);
                      }
                      if (0 < (int)uVar5) {
                        lVar33 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar20 = *(undefined1 (*) [32])(*pauVar28 + lVar33)
                          ;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          lVar1 = uVar18 * 0x20 + lVar33;
                          lVar33 = lVar33 + -0x20;
                        } while (lVar1 != -0x20);
                      }
                      pauVar15 = (undefined1 (*) [32])
                                 ((long)pauVar15 + (long)(int)(uVar10 * 8) * -4);
                      iVar27 = iVar27 + 1;
                    } while (iVar27 != iVar7);
                  }
                  if (0 < iVar23) {
                    iVar7 = 0;
                    do {
                      lVar33 = uVar34 << 5;
                      if (0 < (int)uVar21) {
                        do {
                          *(undefined1 (*) [32])pMVar20 = *(undefined1 (*) [32])(*pauVar15 + lVar33)
                          ;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          lVar33 = lVar33 + -0x20;
                        } while (lVar33 != 0);
                      }
                      if (0 < (int)uVar10) {
                        iVar27 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar20 = *pauVar15;
                          pauVar15 = pauVar15 + 1;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          iVar27 = iVar27 + 1;
                        } while (iVar27 < (int)uVar10);
                      }
                      if (0 < (int)uVar5) {
                        lVar33 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar20 = *(undefined1 (*) [32])(*pauVar15 + lVar33)
                          ;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          lVar1 = uVar18 * 0x20 + lVar33;
                          lVar33 = lVar33 + -0x20;
                        } while (lVar1 != -0x20);
                      }
                      iVar7 = iVar7 + 1;
                    } while (iVar7 < iVar23);
                  }
                  if (0 < iVar8) {
                    uVar12 = (ulong)(int)uVar10;
                    pauVar15 = pauVar15 + uVar12 * -2;
                    iVar7 = 0;
                    do {
                      lVar33 = uVar34 << 5;
                      if (0 < (int)uVar21) {
                        do {
                          *(undefined1 (*) [32])pMVar20 = *(undefined1 (*) [32])(*pauVar15 + lVar33)
                          ;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          lVar33 = lVar33 + -0x20;
                        } while (lVar33 != 0);
                        uVar12 = (ulong)uVar10;
                      }
                      pauVar28 = pauVar15;
                      if (0 < (int)uVar12) {
                        iVar23 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar20 = *pauVar28;
                          pauVar28 = pauVar28 + 1;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          iVar23 = iVar23 + 1;
                          uVar12 = (ulong)uVar10;
                        } while (iVar23 < (int)uVar10);
                      }
                      if (0 < (int)uVar5) {
                        lVar33 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar20 = *(undefined1 (*) [32])(*pauVar28 + lVar33)
                          ;
                          pMVar20 = (Mat *)&pMVar20->allocator;
                          lVar1 = uVar18 * 0x20 + lVar33;
                          lVar33 = lVar33 + -0x20;
                        } while (lVar1 != -0x20);
                        uVar12 = (ulong)uVar10;
                      }
                      pauVar15 = (undefined1 (*) [32])
                                 ((long)pauVar15 + (long)((int)uVar12 * 8) * -4);
                      iVar7 = iVar7 + 1;
                    } while (iVar7 != iVar8);
                  }
                }
                iVar7 = iVar31;
                if (piVar44 != (int *)0x0) {
                  LOCK();
                  *piVar44 = *piVar44 + -1;
                  UNLOCK();
                  if (*piVar44 == 0) {
                    if (pAVar40 == (Allocator *)0x0) {
                      if (__ptr_00 != (undefined1 (*) [32])0x0) {
                        free(__ptr_00);
                      }
                    }
                    else {
                      (*pAVar40->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != (uint)((int)uVar32 >> 3));
            return 0;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0) {
          uVar10 = *(int *)(&this->field_0xe8 + (long)p_Var19) + iVar27 +
                   *(int *)(&this->field_0xec + (long)p_Var19);
          pAVar40 = opt->blob_allocator;
          Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),
                      uVar21 + iVar8 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar10,uVar13,
                      uVar25,8,pAVar40);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar13 < 1) {
              return 0;
            }
            uVar25 = (ulong)uVar10;
            uVar34 = 0;
            do {
              p_Var19 = this->_vptr_Padding_x86_avx512[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                uVar2 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
                auVar39._4_4_ = uVar2;
                auVar39._0_4_ = uVar2;
                auVar39._8_4_ = uVar2;
                auVar39._12_4_ = uVar2;
                auVar39._16_4_ = uVar2;
                auVar39._20_4_ = uVar2;
                auVar39._24_4_ = uVar2;
                auVar39._28_4_ = uVar2;
              }
              else {
                auVar39 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar34 * 0x20);
              }
              pPVar41 = this;
              if (0 < (int)uVar10) {
                uVar18 = 0;
                do {
                  uVar12 = (long)top_blob->h * (long)top_blob->w;
                  pMVar20 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar18 * uVar12 +
                                   top_blob->cstep * uVar34 * top_blob->elemsize);
                  p_Var19 = this->_vptr_Padding_x86_avx512[-3];
                  uVar21 = (int)uVar18 - *(int *)(&this->field_0xe8 + (long)p_Var19);
                  if ((int)uVar21 < 0 || iVar27 <= (int)uVar21) {
                    if (0 < (int)uVar12) {
                      do {
                        pMVar20->data = (void *)auVar39._0_8_;
                        pMVar20->refcount = (int *)auVar39._8_8_;
                        pMVar20->elemsize = auVar39._16_8_;
                        pMVar20->elempack = auVar39._24_4_;
                        *(int *)&pMVar20->field_0x1c = auVar39._28_4_;
                        pMVar20 = (Mat *)&pMVar20->allocator;
                        uVar21 = (int)uVar12 - 1;
                        uVar12 = (ulong)uVar21;
                      } while (uVar21 != 0);
                    }
                  }
                  else {
                    v_01._8_8_ = pPVar41;
                    v_01._0_8_ = pAVar40;
                    v_01[4] = (float)in_stack_fffffffffffffed0;
                    v_01[5] = (float)uVar10;
                    v_01._24_8_ = (long)bottom_blob->data +
                                  (long)bottom_blob->h * (long)bottom_blob->w *
                                  bottom_blob->elemsize * (ulong)uVar21 +
                                  bottom_blob->cstep * uVar34 * bottom_blob->elemsize;
                    pPVar42 = pPVar41;
                    padding_constant_pack8_avx
                              ((ncnn *)&stack0xfffffffffffffed8,pMVar20,(Mat *)(long)top_blob->w,
                               *(int *)(&pPVar41->field_0xd0 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd4 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd8 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xdc + (long)p_Var19),v_01);
                    this = pPVar41;
                    pPVar41 = pPVar42;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar25);
              }
              uVar34 = uVar34 + 1;
              this = pPVar41;
            } while (uVar34 != uVar13);
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar7 == 0x10) {
      switch(iVar31) {
      case 1:
        uVar21 = iVar23 * 0x10 + *(uint *)(&this->field_0xd8 + (long)p_Var19) +
                 *(int *)(&this->field_0xdc + (long)p_Var19);
        if ((((uVar21 & 0xf) == 0) && ((*(uint *)(&this->field_0xd8 + (long)p_Var19) & 0xf) == 0))
           && (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          Mat::create(top_blob,(int)uVar21 >> 4,uVar25 & 0xfffffffffffffff0,0x10,opt->blob_allocator
                     );
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var19 = this->_vptr_Padding_x86_avx512[-3];
            iVar7 = *(int *)(&this->field_0xd8 + (long)p_Var19);
            iVar31 = iVar7 + 0xf;
            if (-1 < iVar7) {
              iVar31 = iVar7;
            }
            vpbroadcastd_avx512f(ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var19)));
            iVar7 = *(int *)(&this->field_0xdc + (long)p_Var19);
            iVar23 = iVar7 + 0xf;
            if (-1 < iVar7) {
              iVar23 = iVar7;
            }
            v_03._8_8_ = this;
            v_03[0] = (float)(int)in_stack_fffffffffffffec0;
            v_03[1] = (float)(int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
            v_03[4] = (float)in_stack_fffffffffffffed0;
            v_03[5] = (float)in_stack_fffffffffffffed4;
            v_03._24_8_ = in_stack_fffffffffffffed8;
            v_03._32_8_ = in_stack_fffffffffffffee0;
            v_03[10] = (float)(int)in_stack_fffffffffffffee8;
            v_03[0xb] = (float)(int)(in_stack_fffffffffffffee8 >> 0x20);
            v_03[0xc] = (float)in_stack_fffffffffffffef0;
            v_03[0xd] = (float)in_stack_fffffffffffffef4;
            v_03._56_8_ = in_stack_fffffffffffffef8;
            padding_constant_pack16_avx512
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0
                       ,iVar31 >> 4,iVar23 >> 4,v_03);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar13 = iVar8 * 0x10 + uVar21 + *(int *)(&this->field_0xd4 + (long)p_Var19);
        if ((((uVar13 & 0xf) == 0) && ((uVar21 & 0xf) == 0)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),(int)uVar13 >> 4,
                      uVar25 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var19 = this->_vptr_Padding_x86_avx512[-3];
            vpbroadcastd_avx512f(ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var19)));
            iVar7 = *(int *)(&this->field_0xd0 + (long)p_Var19);
            iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var19);
            iVar23 = iVar7 + 0xf;
            if (-1 < iVar7) {
              iVar23 = iVar7;
            }
            iVar7 = iVar31 + 0xf;
            if (-1 < iVar31) {
              iVar7 = iVar31;
            }
            v_06._8_8_ = this;
            v_06[0] = (float)(int)in_stack_fffffffffffffec0;
            v_06[1] = (float)(int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
            v_06[4] = (float)in_stack_fffffffffffffed0;
            v_06[5] = (float)in_stack_fffffffffffffed4;
            v_06._24_8_ = in_stack_fffffffffffffed8;
            v_06._32_8_ = in_stack_fffffffffffffee0;
            v_06[10] = (float)(int)in_stack_fffffffffffffee8;
            v_06[0xb] = (float)(int)(in_stack_fffffffffffffee8 >> 0x20);
            v_06[0xc] = (float)in_stack_fffffffffffffef0;
            v_06[0xd] = (float)in_stack_fffffffffffffef4;
            v_06._56_8_ = in_stack_fffffffffffffef8;
            padding_constant_pack16_avx512
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                       iVar23 >> 4,iVar7 >> 4,*(int *)(&this->field_0xd8 + (long)p_Var19),
                       *(int *)(&this->field_0xdc + (long)p_Var19),v_06);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar10 = *(uint *)(&this->field_0xe8 + (long)p_Var19) + uVar13 * 0x10 +
                 *(int *)(&this->field_0xec + (long)p_Var19);
        if (((uVar10 & 0xf) == 0) && ((*(uint *)(&this->field_0xe8 + (long)p_Var19) & 0xf) == 0)) {
          if ((uVar10 == uVar13 * 0x10) || (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
            uVar10 = (int)uVar10 >> 4;
            Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                                 *(int *)(&this->field_0xdc + (long)p_Var19),
                        uVar21 + iVar8 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar10,
                        uVar25 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar7 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
              iVar31 = iVar7 + 0xf;
              if (-1 < iVar7) {
                iVar31 = iVar7;
              }
              if ((int)uVar10 < 1) {
                return 0;
              }
              uVar25 = 0;
              do {
                uVar34 = top_blob->elemsize;
                uVar12 = (long)top_blob->h * (long)top_blob->w;
                uVar18 = (uVar34 * uVar12 + 0xf & 0xfffffffffffffff0) / uVar34;
                if (top_blob->dims == 4) {
                  uVar18 = uVar12;
                }
                pp_Var11 = this->_vptr_Padding_x86_avx512;
                p_Var19 = pp_Var11[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                  auVar35 = vpbroadcastd_avx512f
                                      (ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var19)));
                }
                else {
                  auVar35 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                               (*(long *)(&this->field_0xf8 + (long)p_Var19) +
                                               uVar25 * 0x40));
                }
                pMVar20 = (Mat *)(top_blob->cstep * uVar25 * uVar34 + (long)top_blob->data);
                uVar21 = (int)uVar25 - (iVar31 >> 4);
                if ((int)uVar21 < 0 || (int)uVar13 <= (int)uVar21) {
                  iVar7 = (int)uVar18 * top_blob->d;
                  if (0 < iVar7) {
                    do {
                      auVar3 = vmovdqu64_avx512f(auVar35);
                      pMVar20->data = (void *)auVar3._0_8_;
                      pMVar20->refcount = (int *)auVar3._8_8_;
                      pMVar20->elemsize = auVar3._16_8_;
                      pMVar20->elempack = auVar3._24_4_;
                      *(int *)&pMVar20->field_0x1c = auVar3._28_4_;
                      pMVar20->allocator = (Allocator *)auVar3._32_8_;
                      pMVar20->dims = auVar3._40_4_;
                      pMVar20->w = auVar3._44_4_;
                      pMVar20->h = auVar3._48_4_;
                      pMVar20->d = auVar3._52_4_;
                      pMVar20->c = auVar3._56_4_;
                      *(int *)&pMVar20->field_0x3c = auVar3._60_4_;
                      pMVar20 = (Mat *)&pMVar20->cstep;
                      iVar7 = iVar7 + -1;
                    } while (iVar7 != 0);
                  }
                }
                else {
                  uVar32 = bottom_blob->w;
                  iVar7 = bottom_blob->h;
                  sVar6 = bottom_blob->elemsize;
                  pauVar17 = (undefined1 (*) [64])
                             ((ulong)uVar21 * bottom_blob->cstep * sVar6 + (long)bottom_blob->data);
                  pAVar40 = bottom_blob->allocator;
                  piVar44 = (int *)0x0;
                  iVar23 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                  __ptr_02 = pauVar17;
                  if (iVar23 == 0) {
                    v_04._8_8_ = this;
                    v_04[0] = (float)(int)in_stack_fffffffffffffec0;
                    v_04[1] = (float)(int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
                    v_04[4] = (float)in_stack_fffffffffffffed0;
                    v_04[5] = (float)in_stack_fffffffffffffed4;
                    v_04._24_8_ = pauVar17;
                    v_04[8] = 0.0;
                    v_04[9] = 0.0;
                    v_04[10] = (float)(int)sVar6;
                    v_04[0xb] = (float)(int)(sVar6 >> 0x20);
                    v_04[0xc] = (float)bottom_blob->elempack;
                    v_04[0xd] = (float)in_stack_fffffffffffffef4;
                    v_04._56_8_ = pAVar40;
                    pPVar41 = this;
                    padding_constant_pack16_avx512
                              ((ncnn *)&stack0xfffffffffffffed8,pMVar20,
                               (Mat *)(ulong)(uint)top_blob->w,
                               *(int *)(&this->field_0xd0 + (long)p_Var19),
                               *(int *)(&this->field_0xd4 + (long)p_Var19),
                               *(int *)(&this->field_0xd8 + (long)p_Var19),
                               *(int *)(&this->field_0xdc + (long)p_Var19),v_04);
                    pp_Var11 = this->_vptr_Padding_x86_avx512;
                    p_Var19 = pp_Var11[-3];
                    iVar23 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                    this = pPVar41;
                  }
                  if (iVar23 == 1) {
                    iVar23 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                    iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                    iVar27 = *(int *)(&this->field_0xd8 + (long)p_Var19);
                    iVar14 = *(int *)(&this->field_0xdc + (long)p_Var19);
                    pMVar22 = pMVar20;
                    if (0 < iVar23) {
                      iVar24 = 0;
                      do {
                        auVar35 = vmovdqa64_avx512f(*pauVar17);
                        iVar26 = iVar27;
                        if (0 < iVar27) {
                          do {
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                        }
                        if (0 < (int)uVar32) {
                          iVar26 = 0;
                          pauVar30 = pauVar17;
                          do {
                            auVar35 = vmovdqa64_avx512f(*pauVar30);
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pauVar30 = pauVar30 + 1;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar26 = iVar26 + 1;
                          } while (iVar26 < (int)uVar32);
                        }
                        iVar26 = iVar14;
                        if (0 < iVar14) {
                          do {
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                        }
                        iVar24 = iVar24 + 1;
                      } while (iVar24 != iVar23);
                    }
                    if (0 < iVar7) {
                      iVar23 = 0;
                      do {
                        auVar35 = vmovdqa64_avx512f(*pauVar17);
                        iVar24 = iVar27;
                        if (0 < iVar27) {
                          do {
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar24 = iVar24 + -1;
                          } while (iVar24 != 0);
                        }
                        if (0 < (int)uVar32) {
                          iVar24 = 0;
                          do {
                            auVar35 = vmovdqa64_avx512f(*pauVar17);
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pauVar17 = pauVar17 + 1;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar24 = iVar24 + 1;
                          } while (iVar24 < (int)uVar32);
                        }
                        iVar24 = iVar14;
                        if (0 < iVar14) {
                          do {
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar24 = iVar24 + -1;
                          } while (iVar24 != 0);
                        }
                        iVar23 = iVar23 + 1;
                      } while (iVar23 < iVar7);
                    }
                    if (0 < iVar8) {
                      iVar23 = 0;
                      do {
                        auVar35 = vmovdqa64_avx512f(pauVar17[-(long)(int)uVar32]);
                        iVar24 = iVar27;
                        if (0 < iVar27) {
                          do {
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar24 = iVar24 + -1;
                          } while (iVar24 != 0);
                        }
                        if (0 < (int)uVar32) {
                          iVar24 = 0;
                          pauVar30 = pauVar17 + -(long)(int)uVar32;
                          do {
                            auVar35 = vmovdqa64_avx512f(*pauVar30);
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pauVar30 = pauVar30 + 1;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar24 = iVar24 + 1;
                          } while (iVar24 < (int)uVar32);
                        }
                        iVar24 = iVar14;
                        if (0 < iVar14) {
                          do {
                            auVar3 = vmovdqa64_avx512f(auVar35);
                            pMVar22->data = (void *)auVar3._0_8_;
                            pMVar22->refcount = (int *)auVar3._8_8_;
                            pMVar22->elemsize = auVar3._16_8_;
                            pMVar22->elempack = auVar3._24_4_;
                            *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                            pMVar22->allocator = (Allocator *)auVar3._32_8_;
                            pMVar22->dims = auVar3._40_4_;
                            pMVar22->w = auVar3._44_4_;
                            pMVar22->h = auVar3._48_4_;
                            pMVar22->d = auVar3._52_4_;
                            pMVar22->c = auVar3._56_4_;
                            *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                            pMVar22 = (Mat *)&pMVar22->cstep;
                            iVar24 = iVar24 + -1;
                          } while (iVar24 != 0);
                        }
                        iVar23 = iVar23 + 1;
                      } while (iVar23 != iVar8);
                    }
                  }
                  p_Var19 = pp_Var11[-3];
                  if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 2) {
                    iVar23 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                    iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                    uVar21 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
                    uVar34 = (ulong)uVar21;
                    uVar5 = *(uint *)(&this->field_0xdc + (long)p_Var19);
                    uVar18 = (ulong)uVar5;
                    pauVar17 = (undefined1 (*) [64])
                               (*__ptr_02 + (long)(int)(iVar23 * uVar32 * 0x10) * 4);
                    if (0 < iVar23) {
                      iVar27 = 0;
                      do {
                        lVar33 = uVar34 << 6;
                        if (0 < (int)uVar21) {
                          do {
                            auVar35 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar17 + lVar33));
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            lVar33 = lVar33 + -0x40;
                          } while (lVar33 != 0);
                        }
                        pauVar30 = pauVar17;
                        if (0 < (int)uVar32) {
                          iVar14 = 0;
                          do {
                            auVar35 = vmovdqa64_avx512f(*pauVar30);
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pauVar30 = pauVar30 + 1;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            iVar14 = iVar14 + 1;
                          } while (iVar14 < (int)uVar32);
                        }
                        if (0 < (int)uVar5) {
                          lVar33 = -0x80;
                          do {
                            auVar35 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar30 + lVar33));
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            lVar1 = uVar18 * 0x40 + lVar33;
                            lVar33 = lVar33 + -0x40;
                          } while (lVar1 != -0x40);
                        }
                        pauVar17 = (undefined1 (*) [64])
                                   ((long)pauVar17 + (long)(int)(uVar32 << 4) * -4);
                        iVar27 = iVar27 + 1;
                      } while (iVar27 != iVar23);
                    }
                    if (0 < iVar7) {
                      iVar23 = 0;
                      do {
                        lVar33 = uVar34 << 6;
                        if (0 < (int)uVar21) {
                          do {
                            auVar35 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar17 + lVar33));
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            lVar33 = lVar33 + -0x40;
                          } while (lVar33 != 0);
                        }
                        if (0 < (int)uVar32) {
                          iVar27 = 0;
                          do {
                            auVar35 = vmovdqa64_avx512f(*pauVar17);
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pauVar17 = pauVar17 + 1;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            iVar27 = iVar27 + 1;
                          } while (iVar27 < (int)uVar32);
                        }
                        if (0 < (int)uVar5) {
                          lVar33 = -0x80;
                          do {
                            auVar35 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar17 + lVar33));
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            lVar1 = uVar18 * 0x40 + lVar33;
                            lVar33 = lVar33 + -0x40;
                          } while (lVar1 != -0x40);
                        }
                        iVar23 = iVar23 + 1;
                      } while (iVar23 < iVar7);
                    }
                    if (0 < iVar8) {
                      uVar12 = (ulong)(int)uVar32;
                      pauVar17 = pauVar17 + uVar12 * -2;
                      iVar7 = 0;
                      do {
                        lVar33 = uVar34 << 6;
                        if (0 < (int)uVar21) {
                          do {
                            auVar35 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar17 + lVar33));
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            lVar33 = lVar33 + -0x40;
                          } while (lVar33 != 0);
                          uVar12 = (ulong)uVar32;
                        }
                        pauVar30 = pauVar17;
                        if (0 < (int)uVar12) {
                          iVar23 = 0;
                          do {
                            auVar35 = vmovdqa64_avx512f(*pauVar30);
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pauVar30 = pauVar30 + 1;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            iVar23 = iVar23 + 1;
                            uVar12 = (ulong)uVar32;
                          } while (iVar23 < (int)uVar32);
                        }
                        if (0 < (int)uVar5) {
                          lVar33 = -0x80;
                          do {
                            auVar35 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar30 + lVar33));
                            auVar35 = vmovdqa64_avx512f(auVar35);
                            pMVar20->data = (void *)auVar35._0_8_;
                            pMVar20->refcount = (int *)auVar35._8_8_;
                            pMVar20->elemsize = auVar35._16_8_;
                            pMVar20->elempack = auVar35._24_4_;
                            *(int *)&pMVar20->field_0x1c = auVar35._28_4_;
                            pMVar20->allocator = (Allocator *)auVar35._32_8_;
                            pMVar20->dims = auVar35._40_4_;
                            pMVar20->w = auVar35._44_4_;
                            pMVar20->h = auVar35._48_4_;
                            pMVar20->d = auVar35._52_4_;
                            pMVar20->c = auVar35._56_4_;
                            *(int *)&pMVar20->field_0x3c = auVar35._60_4_;
                            pMVar20 = (Mat *)&pMVar20->cstep;
                            lVar1 = uVar18 * 0x40 + lVar33;
                            lVar33 = lVar33 + -0x40;
                          } while (lVar1 != -0x40);
                          uVar12 = (ulong)uVar32;
                        }
                        pauVar17 = (undefined1 (*) [64])
                                   ((long)pauVar17 + (long)((int)uVar12 << 4) * -4);
                        iVar7 = iVar7 + 1;
                      } while (iVar7 != iVar8);
                    }
                  }
                  if (piVar44 != (int *)0x0) {
                    LOCK();
                    *piVar44 = *piVar44 + -1;
                    UNLOCK();
                    if (*piVar44 == 0) {
                      if (pAVar40 == (Allocator *)0x0) {
                        if (__ptr_02 != (undefined1 (*) [64])0x0) {
                          free(__ptr_02);
                        }
                      }
                      else {
                        (*pAVar40->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar10);
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0) {
          uVar10 = *(int *)(&this->field_0xe8 + (long)p_Var19) + iVar27 +
                   *(int *)(&this->field_0xec + (long)p_Var19);
          pAVar40 = opt->blob_allocator;
          Mat::create(top_blob,iVar23 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),
                      uVar21 + iVar8 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar10,uVar13,
                      uVar25,0x10,pAVar40);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar13 < 1) {
              return 0;
            }
            uVar25 = (ulong)uVar10;
            uVar34 = 0;
            do {
              p_Var19 = this->_vptr_Padding_x86_avx512[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                auVar35 = vpbroadcastd_avx512f
                                    (ZEXT416(*(uint *)(&this->field_0xe4 + (long)p_Var19)));
              }
              else {
                auVar35 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                             (*(long *)(&this->field_0xf8 + (long)p_Var19) +
                                             uVar34 * 0x40));
              }
              pPVar41 = this;
              if (0 < (int)uVar10) {
                uVar18 = 0;
                auVar3 = vmovdqu64_avx512f(auVar35);
                do {
                  uVar12 = (long)top_blob->h * (long)top_blob->w;
                  pMVar20 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar18 * uVar12 +
                                   top_blob->cstep * uVar34 * top_blob->elemsize);
                  p_Var19 = this->_vptr_Padding_x86_avx512[-3];
                  uVar21 = (int)uVar18 - *(int *)(&this->field_0xe8 + (long)p_Var19);
                  if ((int)uVar21 < 0 || iVar27 <= (int)uVar21) {
                    if (0 < (int)uVar12) {
                      do {
                        auVar4 = vmovdqu64_avx512f(auVar35);
                        pMVar20->data = (void *)auVar4._0_8_;
                        pMVar20->refcount = (int *)auVar4._8_8_;
                        pMVar20->elemsize = auVar4._16_8_;
                        pMVar20->elempack = auVar4._24_4_;
                        *(int *)&pMVar20->field_0x1c = auVar4._28_4_;
                        pMVar20->allocator = (Allocator *)auVar4._32_8_;
                        pMVar20->dims = auVar4._40_4_;
                        pMVar20->w = auVar4._44_4_;
                        pMVar20->h = auVar4._48_4_;
                        pMVar20->d = auVar4._52_4_;
                        pMVar20->c = auVar4._56_4_;
                        *(int *)&pMVar20->field_0x3c = auVar4._60_4_;
                        pMVar20 = (Mat *)&pMVar20->cstep;
                        uVar21 = (int)uVar12 - 1;
                        uVar12 = (ulong)uVar21;
                      } while (uVar21 != 0);
                    }
                  }
                  else {
                    sVar6 = bottom_blob->elemsize;
                    v_05._8_8_ = pPVar41;
                    v_05._0_8_ = pAVar40;
                    v_05[4] = (float)in_stack_fffffffffffffed0;
                    v_05[5] = (float)uVar10;
                    v_05._24_8_ = (long)bottom_blob->data +
                                  (long)bottom_blob->h * (long)bottom_blob->w * sVar6 *
                                  (ulong)uVar21 + bottom_blob->cstep * uVar34 * sVar6;
                    v_05[8] = 0.0;
                    v_05[9] = 0.0;
                    v_05[10] = (float)(int)sVar6;
                    v_05[0xb] = (float)(int)(sVar6 >> 0x20);
                    v_05[0xc] = (float)bottom_blob->elempack;
                    v_05[0xd] = (float)in_stack_fffffffffffffef4;
                    v_05._56_8_ = bottom_blob->allocator;
                    pPVar42 = pPVar41;
                    padding_constant_pack16_avx512
                              ((ncnn *)&stack0xfffffffffffffed8,pMVar20,(Mat *)(long)top_blob->w,
                               *(int *)(&pPVar41->field_0xd0 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd4 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd8 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xdc + (long)p_Var19),v_05);
                    auVar35 = vmovdqu64_avx512f(auVar3);
                    this = pPVar41;
                    pPVar41 = pPVar42;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar25);
              }
              uVar34 = uVar34 + 1;
              this = pPVar41;
            } while (uVar34 != uVar13);
            return 0;
          }
          return -100;
        }
      }
    }
  }
  piVar44 = bottom_blob->refcount;
  __ptr = bottom_blob->data;
  piVar43 = bottom_blob->refcount;
  pAVar40 = bottom_blob->allocator;
  if (piVar44 != (int *)0x0) {
    LOCK();
    *piVar44 = *piVar44 + 1;
    UNLOCK();
  }
  if (iVar7 != 1) {
    auVar35 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar35 = vmovdqu64_avx512f(auVar35);
    local_78._16_48_ = auVar35._16_48_;
    local_78._0_8_ = auVar35._0_8_;
    local_78._8_8_ = opt->workspace_allocator;
    convert_packing(bottom_blob,(Mat *)&stack0xfffffffffffffed8,1,(Option *)local_78);
  }
  iVar7 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86_avx512 +
                           (long)this->_vptr_Padding_x86_avx512[-3]),(Mat *)&stack0xfffffffffffffed8
                           ,top_blob,opt);
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 == 0) {
      if (pAVar40 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (*pAVar40->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int Padding_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}